

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  mapped_type_conflict1 *pmVar5;
  CropLayerParams *pCVar6;
  BorderAmounts *pBVar7;
  bool local_429;
  Result local_380;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  string err_2;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  string err;
  _Self local_168;
  _Self local_160;
  _Self local_158;
  allocator local_149;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,2);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar2 = Result::good((Result *)local_48);
  uVar1 = r.m_message.field_2._8_8_;
  if (!bVar2) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a31a8d;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Crop",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar1,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar2 = Result::good((Result *)local_48);
    uVar1 = r.m_message.field_2._8_8_;
    if (!bVar2) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a31a8d;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"Crop",&local_149);
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar1,&local_148,3,-1,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    bVar2 = Result::good((Result *)local_48);
    if (!bVar2) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a31a8d;
    }
    iVar3 = Specification::NeuralNetworkLayer::input_size
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    if (1 < iVar3) {
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
      local_158._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->blobNameToRank,psVar4);
      local_160._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->blobNameToRank);
      bVar2 = std::operator!=(&local_158,&local_160);
      local_429 = false;
      if (bVar2) {
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
        local_168._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->blobNameToRank,psVar4);
        err.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end(&this->blobNameToRank);
        local_429 = std::operator!=(&local_168,(_Self *)((long)&err.field_2 + 8));
      }
      if (local_429 != false) {
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,psVar4);
        iVar3 = *pmVar5;
        psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,psVar4);
        if (iVar3 != *pmVar5) {
          std::__cxx11::string::string((string *)local_190);
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::__cxx11::string::string((string *)(err_1.field_2._M_local_buf + 8),(string *)psVar4);
          std::operator+(&local_1d0,"Layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&err_1.field_2 + 8));
          std::operator+(&local_1b0,&local_1d0,
                         "\' of type \'Crop\' expects equal ranks for its inputs, but they are not equal."
                        );
          std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_190);
          local_ac = 1;
          std::__cxx11::string::~string((string *)local_190);
          goto LAB_00a31a8d;
        }
      }
    }
  }
  iVar3 = Specification::NeuralNetworkLayer::input_size
                    ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  if (iVar3 == 1) {
    pCVar6 = Specification::NeuralNetworkLayer::crop
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pBVar7 = Specification::CropLayerParams::cropamounts(pCVar6);
    iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar7);
    if (iVar3 != 2) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_270,"cropAmounts parameter for the crop layer \'",psVar4);
      std::operator+(&local_250,&local_270,"\' is of length ");
      pCVar6 = Specification::NeuralNetworkLayer::crop
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      pBVar7 = Specification::CropLayerParams::cropamounts(pCVar6);
      iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar7);
      std::__cxx11::to_string(&local_290,iVar3);
      std::operator+(&local_230,&local_250,&local_290);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     &local_230," but requires exactly two crop constraints (for X,Y axes).");
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      Result::Result((Result *)((long)&err_2.field_2 + 8),INVALID_MODEL_PARAMETERS,
                     (string *)local_210);
      Result::operator=((Result *)local_48,(Result *)((long)&err_2.field_2 + 8));
      Result::~Result((Result *)((long)&err_2.field_2 + 8));
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_210);
      goto LAB_00a31a8d;
    }
  }
  else {
    pCVar6 = Specification::NeuralNetworkLayer::crop
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    iVar3 = Specification::CropLayerParams::offset_size(pCVar6);
    if (iVar3 != 2) {
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_338,"Offset parameter for the crop layer \'",psVar4);
      std::operator+(&local_318,&local_338,"\' is of length ");
      pCVar6 = Specification::NeuralNetworkLayer::crop
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      iVar3 = Specification::CropLayerParams::offset_size(pCVar6);
      std::__cxx11::to_string(&local_358,iVar3);
      std::operator+(&local_2f8,&local_318,&local_358);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                     &local_2f8," but requires exactly two offsets (for X,Y axes).");
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      Result::Result(&local_380,INVALID_MODEL_PARAMETERS,(string *)local_2d8);
      Result::operator=((Result *)local_48,&local_380);
      Result::~Result(&local_380);
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_2d8);
      goto LAB_00a31a8d;
    }
  }
  Result::Result(__return_storage_ptr__,(Result *)local_48);
  local_ac = 1;
LAB_00a31a8d:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Crop", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Crop", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    return r;
}